

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_lib.cc
# Opt level: O1

size_t SSL_CTX_sess_number(SSL_CTX *ctx)

{
  size_t sVar1;
  
  CRYPTO_MUTEX_lock_read(&ctx->lock);
  sVar1 = OPENSSL_lh_num_items((_LHASH *)ctx->sessions);
  CRYPTO_MUTEX_unlock_read(&ctx->lock);
  return sVar1;
}

Assistant:

size_t SSL_CTX_sess_number(const SSL_CTX *ctx) {
  MutexReadLock lock(const_cast<CRYPTO_MUTEX *>(&ctx->lock));
  return lh_SSL_SESSION_num_items(ctx->sessions);
}